

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::TransRangeSyntax::TransRangeSyntax
          (TransRangeSyntax *this,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *items,
          TransRepeatRangeSyntax *repeat)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  ulong uVar5;
  long lVar6;
  
  (this->super_SyntaxNode).kind = TransRange;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  uVar3 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (items->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (items->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e5cf8;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e62d0;
  sVar2 = (items->elements)._M_extent._M_extent_value;
  (this->items).elements._M_ptr = (items->elements)._M_ptr;
  (this->items).elements._M_extent._M_extent_value = sVar2;
  this->repeat = repeat;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar5 = (this->items).elements._M_extent._M_extent_value + 1;
  if (1 < uVar5) {
    uVar5 = uVar5 >> 1;
    lVar6 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->items).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar6));
      (*ppSVar4)->parent = &this->super_SyntaxNode;
      lVar6 = lVar6 + 0x30;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  if (this->repeat != (TransRepeatRangeSyntax *)0x0) {
    (this->repeat->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

TransRangeSyntax(const SeparatedSyntaxList<ExpressionSyntax>& items, TransRepeatRangeSyntax* repeat) :
        SyntaxNode(SyntaxKind::TransRange), items(items), repeat(repeat) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
        if (this->repeat) this->repeat->parent = this;
    }